

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

Abc_Cex_t *
Bmc_CexEssentialBitOne(Gia_Man_t *p,Abc_Cex_t *pCexState,int iBit,Abc_Cex_t *pCexPrev,int *pfEqual)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  int iVar3;
  Abc_Cex_t *p_00;
  int iVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int local_54;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x289,
                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                 );
  }
  if (pCexState->nBits <= iBit) {
    __assert_fail("iBit < pCexState->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x28a,
                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                 );
  }
  if (pfEqual != (int *)0x0) {
    *pfEqual = 0;
  }
  p_00 = Abc_CexAllocFull(0,p->vCis->nSize,pCexState->iFrame + 1);
  iVar3 = pCexState->iFrame;
  p_00->iPo = pCexState->iPo;
  p_00->iFrame = iVar3;
  (&p_00[1].iPo)[iBit >> 5] = (&p_00[1].iPo)[iBit >> 5] ^ 1 << ((byte)iBit & 0x1f);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  uVar20 = (long)iBit / (long)pCexState->nPis;
  uVar12 = uVar20 & 0xffffffff;
  local_54 = (int)uVar20;
  if (local_54 <= pCexState->iFrame) {
    do {
      local_54 = local_54 + 1;
      pVVar6 = p->vCis;
      iVar3 = (int)uVar12;
      if (0 < pVVar6->nSize) {
        lVar14 = 0;
        do {
          lVar7 = (long)pVVar6->pArray[lVar14];
          if ((lVar7 < 0) || (p->nObjs <= pVVar6->pArray[lVar14])) goto LAB_00586fbf;
          pGVar1 = p->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) goto LAB_00586c6a;
          lVar8 = (ulong)(uint)(pCexState->nPis * iVar3) + lVar14;
          uVar12 = (ulong)(((uint)(&pCexState[1].iPo)[(int)lVar8 >> 5] >> ((byte)lVar8 & 0x1f) & 1)
                          << 0x1e);
          uVar20 = *(ulong *)(pGVar1 + lVar7);
          *(ulong *)(pGVar1 + lVar7) = uVar20 & 0xffffffffbfffffff | uVar12;
          uVar9 = pCexState->nPis * iVar3 + (int)lVar14;
          *(ulong *)(pGVar1 + lVar7) =
               uVar20 & 0xbfffffffbfffffff | uVar12 |
               (ulong)(((uint)(&p_00[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) << 0x3e;
          lVar14 = lVar14 + 1;
          pVVar6 = p->vCis;
        } while (lVar14 < pVVar6->nSize);
      }
      if (0 < p->nObjs) {
LAB_00586c6a:
        lVar14 = 0;
        lVar7 = 0;
        do {
          pGVar1 = p->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          uVar20 = *(ulong *)(&pGVar1->field_0x0 + lVar14);
          if ((uVar20 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar20) {
            uVar9 = (int)(uVar20 & 0x1fffffff) << 2;
            uVar13 = (uint)(uVar20 >> 0x1d) & 7 ^
                     *(uint *)((long)pGVar1 + lVar14 + (ulong)uVar9 * -3) >> 0x1e;
            uVar10 = (uint)(uVar20 >> 0x1e) & 0x7ffffffc;
            uVar19 = *(uint *)((long)pGVar1 + lVar14 + (ulong)uVar10 * -3) >> 0x1e & 1;
            uVar15 = (uint)(uVar20 >> 0x3d) & 1;
            uVar11 = (uVar19 ^ uVar15) & uVar13;
            uVar12 = (ulong)(uVar11 << 0x1e);
            *(ulong *)(&pGVar1->field_0x0 + lVar14) = uVar20 & 0xffffffff3fffffff | uVar12;
            if (uVar11 == 0) {
              if (((uVar13 & 1) == 0) && (uVar19 == uVar15)) {
                uVar12 = *(ulong *)((long)pGVar1 + lVar14 + (ulong)uVar10 * -3) |
                         *(ulong *)((long)pGVar1 + lVar14 + (ulong)uVar9 * -3);
              }
              else {
                if ((uVar13 & 1) != 0) {
                  if (uVar19 != uVar15) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                  ,0x2aa,
                                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                                 );
                  }
                  uVar20 = uVar20 & 0xbfffffff3fffffff |
                           *(ulong *)((long)pGVar1 + lVar14 + (ulong)uVar10 * -3) &
                           0x4000000000000000;
                  goto LAB_00586dcc;
                }
                uVar12 = *(ulong *)((long)pGVar1 + lVar14 + (ulong)uVar9 * -3);
              }
              uVar20 = uVar20 & 0xbfffffff3fffffff | uVar12 & 0x4000000000000000;
            }
            else {
              uVar20 = uVar20 & 0xbfffffff3fffffff | uVar12 |
                       *(ulong *)((long)pGVar1 + lVar14 + (ulong)uVar9 * -3) & 0x4000000000000000 &
                       *(ulong *)((long)pGVar1 + lVar14 + (ulong)uVar10 * -3);
            }
LAB_00586dcc:
            *(ulong *)(&pGVar1->field_0x0 + lVar14) = uVar20;
          }
          lVar7 = lVar7 + 1;
          lVar14 = lVar14 + 0xc;
        } while (lVar7 < p->nObjs);
      }
      pVVar6 = p->vCos;
      if (0 < pVVar6->nSize) {
        lVar14 = 0;
        do {
          iVar5 = pVVar6->pArray[lVar14];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00586fbf;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar1 = p->pObjs + iVar5;
          uVar20 = *(ulong *)pGVar1;
          uVar12 = (ulong)((uint)uVar20 & 0x1fffffff);
          uVar17 = (ulong)(((uint)uVar20 * 2 ^ *(uint *)(pGVar1 + -uVar12)) & 0x40000000);
          *(ulong *)pGVar1 = uVar20 & 0xffffffffbfffffff | uVar17;
          *(ulong *)pGVar1 =
               uVar20 & 0xbfffffffbfffffff | uVar17 |
               *(ulong *)(pGVar1 + -uVar12) & 0x4000000000000000;
          lVar14 = lVar14 + 1;
          pVVar6 = p->vCos;
        } while (lVar14 < pVVar6->nSize);
      }
      iVar5 = pCexState->iFrame;
      if (iVar3 < iVar5) {
        iVar5 = p->nRegs;
        uVar9 = (uint)(pCexPrev != (Abc_Cex_t *)0x0);
        if (iVar5 < 1) {
LAB_00586f96:
          if (pfEqual != (int *)0x0) {
            *pfEqual = uVar9;
          }
          Abc_CexFree(p_00);
          return (Abc_Cex_t *)0x0;
        }
        iVar16 = (pCexState->nPis * local_54 + p->vCis->nSize) - iVar5;
        bVar2 = false;
        iVar18 = 0;
        do {
          uVar10 = (pVVar6->nSize - iVar5) + iVar18;
          if (((int)uVar10 < 0) || (pVVar6->nSize <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar4 = pVVar6->pArray[uVar10];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00586fbf:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar20 = *(ulong *)(p->pObjs + iVar4);
          if ((pCexPrev != (Abc_Cex_t *)0x0) && (uVar9 != 0)) {
            iVar4 = iVar16 + iVar18;
            uVar9 = ~((uint)(&pCexPrev[1].iPo)[iVar4 >> 5] >> ((byte)iVar4 & 0x1f) ^
                     (uint)(uVar20 >> 0x3e)) & 1;
          }
          if ((uVar20 & 0x4000000000000000) == 0) {
            iVar5 = iVar16 + iVar18;
            bVar2 = true;
            (&p_00[1].iPo)[iVar5 >> 5] = (&p_00[1].iPo)[iVar5 >> 5] ^ 1 << ((byte)iVar5 & 0x1f);
            iVar5 = p->nRegs;
          }
          iVar18 = iVar18 + 1;
        } while (iVar18 < iVar5);
        if ((!bVar2) || (uVar9 != 0)) goto LAB_00586f96;
        iVar5 = pCexState->iFrame;
      }
      uVar12 = (ulong)(iVar3 + 1);
    } while (iVar3 < iVar5);
  }
  return p_00;
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBitOne( Gia_Man_t * p, Abc_Cex_t * pCexState, int iBit, Abc_Cex_t * pCexPrev, int * pfEqual )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    assert( pCexState->nRegs == 0 );
    assert( iBit < pCexState->nBits );
    if ( pfEqual )
        *pfEqual = 0;
    // start the counter-example
    pNew = Abc_CexAllocFull( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // clean bit
    Abc_InfoXorBit( pNew->pData, iBit );
    // simulate the remaining frames
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = iBit / pCexState->nPis; i <= pCexState->iFrame; i++ )
    {
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCexState->pData, i * pCexState->nPis + k );
            pObj->fMark1 = Abc_InfoHasBit( pNew->pData,      i * pCexState->nPis + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }
        if ( i < pCexState->iFrame )
        {
            int fChanges  = 0;
            int fEqual    = (pCexPrev != NULL);
            int iBitShift = (i + 1) * pCexState->nPis + Gia_ManPiNum(p);
            Gia_ManForEachRi( p, pObj, k )
            {
                if ( fEqual && pCexPrev && (int)pObj->fMark1 != Abc_InfoHasBit(pCexPrev->pData, iBitShift + k) )
                    fEqual = 0;
                if ( !pObj->fMark1 )
                {
                    fChanges = 1;
                    Abc_InfoXorBit( pNew->pData, iBitShift + k );
                }
            }
            if ( !fChanges || fEqual )
            {
                if ( pfEqual )
                    *pfEqual = fEqual;
                Abc_CexFree( pNew );
                return NULL;
            }
        }
/*
        if ( i == 20 )
        {
            printf( "Frame %d : ", i );
            Gia_ManForEachRi( p, pObj, k )
                printf( "%d", pObj->fMark1 );
            printf( "\n" );
        }
*/
    }
    return pNew;
}